

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void cume_distStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  char *pcVar1;
  i64 iVar2;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    pcVar1 = (char *)createAggContext(pCtx,0x18);
  }
  else {
    pcVar1 = pCtx->pMem->z;
  }
  if (pcVar1 != (char *)0x0) {
    if (*(long *)(pcVar1 + 0x10) == 0) {
      iVar2 = sqlite3VdbeIntValue(*apArg);
      *(i64 *)(pcVar1 + 0x10) = iVar2;
    }
    *(long *)(pcVar1 + 8) = *(long *)(pcVar1 + 8) + 1;
  }
  return;
}

Assistant:

static void cume_distStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct CallCount *p;
  assert( nArg==1 ); UNUSED_PARAMETER(nArg);

  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nTotal==0 ){
      p->nTotal = sqlite3_value_int64(apArg[0]);
    }
    p->nStep++;
  }
}